

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_reconfig(Terminal *term,Conf *conf)

{
  optionalrgb oVar1;
  bidi_cache_entry *pbVar2;
  unsigned_long uVar3;
  truecolour tVar4;
  wchar_t wVar5;
  undefined4 uVar6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  _Bool _Var13;
  _Bool _Var14;
  _Bool _Var15;
  _Bool _Var16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  char *__s2;
  Conf *conf_00;
  int iVar22;
  bool bVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  
  _Var7 = conf_get_bool(term->conf,0x6c);
  _Var8 = conf_get_bool(conf,0x6c);
  _Var9 = conf_get_bool(term->conf,0x6b);
  _Var10 = conf_get_bool(conf,0x6b);
  _Var11 = conf_get_bool(term->conf,0x7a);
  _Var12 = conf_get_bool(conf,0x7a);
  _Var13 = conf_get_bool(term->conf,0x7b);
  _Var14 = conf_get_bool(conf,0x7b);
  bVar23 = false;
  iVar22 = 0;
  do {
    iVar17 = conf_get_int_int(term->conf,0x9d,iVar22);
    iVar18 = conf_get_int_int(conf,0x9d,iVar22);
    if (iVar17 != iVar18) {
      bVar23 = true;
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 0x100);
  _Var15 = conf_get_bool(term->conf,0x8d);
  _Var16 = conf_get_bool(conf,0x8d);
  if (_Var15 == _Var16) {
    _Var15 = conf_get_bool(term->conf,0x8e);
    _Var16 = conf_get_bool(conf,0x8e);
    if (_Var15 == _Var16) goto LAB_001085de;
  }
  if (term->bidi_cache_size != 0) {
    lVar25 = 8;
    uVar24 = 0;
    do {
      safefree(*(void **)((long)&term->pre_bidi_cache->width + lVar25));
      safefree(*(void **)((long)&term->post_bidi_cache->width + lVar25));
      pbVar2 = term->pre_bidi_cache;
      *(undefined4 *)((long)pbVar2 + lVar25 + -8) = 0xffffffff;
      *(undefined8 *)((long)&pbVar2->width + lVar25) = 0;
      pbVar2 = term->post_bidi_cache;
      *(undefined4 *)((long)pbVar2 + lVar25 + -8) = 0xffffffff;
      *(undefined8 *)((long)&pbVar2->width + lVar25) = 0;
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x20;
    } while (uVar24 < term->bidi_cache_size);
  }
LAB_001085de:
  pcVar21 = conf_get_str(term->conf,0x69);
  __s2 = conf_get_str(conf,0x69);
  iVar22 = strcmp(pcVar21,__s2);
  if (iVar22 != 0) {
    safefree(term->window_title);
    pcVar21 = dupstr(__s2);
    term->window_title = pcVar21;
    term->wintitle_codepage = L'\xffff';
    term->win_title_pending = true;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
    }
  }
  bVar26 = true;
  iVar22 = 0;
  uVar20 = 0;
  do {
    iVar17 = 0;
    do {
      iVar18 = conf_get_int_int(term->conf,0x95,iVar17 + iVar22);
      iVar19 = conf_get_int_int(conf,0x95,iVar17 + iVar22);
      if (iVar18 != iVar19) goto LAB_001086ed;
      iVar17 = iVar17 + 1;
    } while (iVar17 != 3);
    bVar26 = uVar20 < 0x15;
    uVar20 = uVar20 + 1;
    iVar22 = iVar22 + 3;
  } while (uVar20 != 0x16);
LAB_001086ed:
  conf_free(term->conf);
  conf_00 = conf_copy(conf);
  term->conf = conf_00;
  if (_Var7 != _Var8) {
    _Var7 = conf_get_bool(conf_00,0x6c);
    term->wrap = _Var7;
    term->alt_wrap = _Var7;
  }
  if (_Var9 != _Var10) {
    _Var7 = conf_get_bool(term->conf,0x6b);
    term->dec_om = _Var7;
    term->alt_om = _Var7;
  }
  if (_Var11 != _Var12) {
    _Var7 = conf_get_bool(term->conf,0x7a);
    term->use_bce = _Var7;
    uVar3 = (term->basic_erase_char).attr;
    tVar4 = (term->basic_erase_char).truecolour;
    wVar5 = (term->basic_erase_char).cc_next;
    uVar6 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
    (term->erase_char).chr = (term->basic_erase_char).chr;
    (term->erase_char).attr = uVar3;
    (term->erase_char).truecolour = tVar4;
    (term->erase_char).cc_next = wVar5;
    *(undefined4 *)&(term->erase_char).field_0x1c = uVar6;
    if (_Var7) {
      oVar1 = (term->curr_truecolour).bg;
      (term->erase_char).attr = (ulong)(uint)(term->curr_attr & 0x3ffff);
      (term->erase_char).truecolour.bg = oVar1;
    }
  }
  if (_Var13 != _Var14) {
    _Var7 = conf_get_bool(term->conf,0x7b);
    term->blink_is_real = _Var7;
  }
  if (bVar23) {
    lVar25 = 0;
    do {
      iVar22 = conf_get_int_int(term->conf,0x9d,(int)lVar25);
      term->wordness[lVar25] = (short)iVar22;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x100);
  }
  _Var7 = conf_get_bool(term->conf,0x50);
  if (_Var7) {
    swap_screen(term,L'\0',false,false);
  }
  _Var7 = conf_get_bool(term->conf,0x54);
  if (_Var7) {
    term->cset_attr[0] = L'\xd800';
    term->cset_attr[1] = L'\xd800';
    term->alt_sco_acs = L'\0';
    term->sco_acs = L'\0';
    term->utf = false;
  }
  pcVar21 = conf_get_str(term->conf,0x8c);
  if (pcVar21 == (char *)0x0) {
    term_print_finish(term);
  }
  if (bVar26) {
    palette_reset(term,true);
  }
  term_schedule_tblink(term);
  term_schedule_cblink(term);
  term_copy_stuff_from_conf(term);
  term_update_raw_mouse_mode(term);
  return;
}

Assistant:

void term_reconfig(Terminal *term, Conf *conf)
{
    /*
     * Before adopting the new config, check all those terminal
     * settings which control power-on defaults; and if they've
     * changed, we will modify the current state as well as the
     * default one. The full list is: Auto wrap mode, DEC Origin
     * Mode, BCE, blinking text, character classes.
     */
    bool reset_wrap, reset_decom, reset_bce, reset_tblink, reset_charclass;
    bool palette_changed = false;
    int i;

    reset_wrap = (conf_get_bool(term->conf, CONF_wrap_mode) !=
                  conf_get_bool(conf, CONF_wrap_mode));
    reset_decom = (conf_get_bool(term->conf, CONF_dec_om) !=
                   conf_get_bool(conf, CONF_dec_om));
    reset_bce = (conf_get_bool(term->conf, CONF_bce) !=
                 conf_get_bool(conf, CONF_bce));
    reset_tblink = (conf_get_bool(term->conf, CONF_blinktext) !=
                    conf_get_bool(conf, CONF_blinktext));
    reset_charclass = false;
    for (i = 0; i < 256; i++)
        if (conf_get_int_int(term->conf, CONF_wordness, i) !=
            conf_get_int_int(conf, CONF_wordness, i))
            reset_charclass = true;

    /*
     * If the bidi or shaping settings have changed, flush the bidi
     * cache completely.
     */
    if (conf_get_bool(term->conf, CONF_no_arabicshaping) !=
        conf_get_bool(conf, CONF_no_arabicshaping) ||
        conf_get_bool(term->conf, CONF_no_bidi) !=
        conf_get_bool(conf, CONF_no_bidi)) {
        for (i = 0; i < term->bidi_cache_size; i++) {
            sfree(term->pre_bidi_cache[i].chars);
            sfree(term->post_bidi_cache[i].chars);
            term->pre_bidi_cache[i].width = -1;
            term->pre_bidi_cache[i].chars = NULL;
            term->post_bidi_cache[i].width = -1;
            term->post_bidi_cache[i].chars = NULL;
        }
    }

    {
        const char *old_title = conf_get_str(term->conf, CONF_wintitle);
        const char *new_title = conf_get_str(conf, CONF_wintitle);
        if (strcmp(old_title, new_title)) {
            sfree(term->window_title);
            term->window_title = dupstr(new_title);
            term->wintitle_codepage = DEFAULT_CODEPAGE;
            term->win_title_pending = true;
            term_schedule_update(term);
        }
    }

    /*
     * Just setting conf is sufficient to cause colour setting changes
     * to appear on the next ESC]R palette reset. But we should also
     * check whether any colour settings have been changed, so that
     * they can be updated immediately if they haven't been overridden
     * by some escape sequence.
     */
    {
        int i, j;
        for (i = 0; i < CONF_NCOLOURS; i++) {
            for (j = 0; j < 3; j++)
                if (conf_get_int_int(term->conf, CONF_colours, i*3+j) !=
                    conf_get_int_int(conf, CONF_colours, i*3+j))
                    break;
            if (j < 3) {
                /* Actually enacting the change has to be deferred 
                 * until the new conf is installed. */
                palette_changed = true;
                break;
            }
        }
    }

    conf_free(term->conf);
    term->conf = conf_copy(conf);

    if (reset_wrap)
        term->alt_wrap = term->wrap = conf_get_bool(term->conf, CONF_wrap_mode);
    if (reset_decom)
        term->alt_om = term->dec_om = conf_get_bool(term->conf, CONF_dec_om);
    if (reset_bce) {
        term->use_bce = conf_get_bool(term->conf, CONF_bce);
        set_erase_char(term);
    }
    if (reset_tblink) {
        term->blink_is_real = conf_get_bool(term->conf, CONF_blinktext);
    }
    if (reset_charclass)
        for (i = 0; i < 256; i++)
            term->wordness[i] = conf_get_int_int(term->conf, CONF_wordness, i);

    if (conf_get_bool(term->conf, CONF_no_alt_screen))
        swap_screen(term, 0, false, false);
    if (conf_get_bool(term->conf, CONF_no_remote_charset)) {
        term->cset_attr[0] = term->cset_attr[1] = CSET_ASCII;
        term->sco_acs = term->alt_sco_acs = 0;
        term->utf = false;
    }
    if (!conf_get_str(term->conf, CONF_printer)) {
        term_print_finish(term);
    }
    if (palette_changed)
        term_notify_palette_changed(term);
    term_schedule_tblink(term);
    term_schedule_cblink(term);
    term_copy_stuff_from_conf(term);
    term_update_raw_mouse_mode(term);
}